

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int luaL_argerror(lua_State *L,int narg,char *extramsg)

{
  int iVar1;
  ulong uVar2;
  lua_Debug ar;
  lua_Debug local_a0;
  
  uVar2 = (ulong)(uint)narg;
  iVar1 = lua_getstack(L,0,&local_a0);
  if (iVar1 == 0) {
    iVar1 = luaL_error(L,"bad argument #%d (%s)",uVar2,extramsg);
  }
  else {
    lua_getinfo(L,"n",&local_a0);
    iVar1 = strcmp(local_a0.namewhat,"method");
    if ((iVar1 == 0) && (uVar2 = (ulong)(narg - 1U), narg - 1U == 0)) {
      iVar1 = luaL_error(L,"calling \'%s\' on bad self (%s)",local_a0.name,extramsg);
    }
    else {
      if (local_a0.name == (char *)0x0) {
        iVar1 = pushglobalfuncname(L,&local_a0);
        if (iVar1 == 0) {
          local_a0.name = "?";
        }
        else {
          local_a0.name = lua_tolstring(L,-1,(size_t *)0x0);
        }
      }
      iVar1 = luaL_error(L,"bad argument #%d to \'%s\' (%s)",uVar2,local_a0.name,extramsg);
    }
  }
  return iVar1;
}

Assistant:

LUALIB_API int luaL_argerror (lua_State *L, int narg, const char *extramsg) {
  lua_Debug ar;
  if (!lua_getstack(L, 0, &ar))  /* no stack frame? */
    return luaL_error(L, "bad argument #%d (%s)", narg, extramsg);
  lua_getinfo(L, "n", &ar);
  if (strcmp(ar.namewhat, "method") == 0) {
    narg--;  /* do not count `self' */
    if (narg == 0)  /* error is in the self argument itself? */
      return luaL_error(L, "calling " LUA_QS " on bad self (%s)",
                           ar.name, extramsg);
  }
  if (ar.name == NULL)
    ar.name = (pushglobalfuncname(L, &ar)) ? lua_tostring(L, -1) : "?";
  return luaL_error(L, "bad argument #%d to " LUA_QS " (%s)",
                        narg, ar.name, extramsg);
}